

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O3

void hexdump(char *data,char *mask,size_t len)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  int i;
  ulong uVar5;
  bool bVar6;
  ulong uVar7;
  char *pcVar8;
  
  uVar7 = 0;
  pcVar8 = data;
  do {
    printf("#%07x: ",uVar7 & 0xffffffff);
    lVar3 = 0;
    iVar2 = 0;
    do {
      uVar5 = 0;
      bVar1 = true;
      do {
        iVar4 = iVar2;
        bVar6 = bVar1;
        uVar5 = uVar5 | lVar3 * 2 + uVar7;
        if ((long)(int)len <= (long)uVar5) goto LAB_0010172d;
        if (mask == (char *)0x0) {
          printf("%02x",(ulong)(byte)data[uVar5]);
        }
        else {
          if (mask[uVar5] != '\0') {
            printf("%s","\x1b[30;1m");
          }
          printf("%02x",(ulong)(byte)data[uVar5]);
          if (mask[uVar5] != '\0') {
            printf("%s","\x1b[0m");
          }
        }
        uVar5 = 1;
        bVar1 = false;
        iVar2 = iVar4 + 2;
      } while (bVar6);
      putchar(0x20);
      iVar2 = iVar4 + 3;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 8);
    iVar4 = iVar4 + 3;
LAB_0010172d:
    if (iVar4 < 0x29) {
      iVar4 = iVar4 + -0x29;
      do {
        putchar(0x20);
        iVar4 = iVar4 + 1;
      } while (iVar4 != 0);
    }
    lVar3 = 0;
    do {
      iVar4 = (int)pcVar8[lVar3];
      iVar2 = isprint(iVar4);
      if (iVar2 == 0) {
        iVar4 = 0x2e;
      }
      putchar(iVar4);
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x10);
    putchar(10);
    uVar7 = uVar7 + 0x10;
    pcVar8 = pcVar8 + 0x10;
    if ((int)len <= (int)uVar7) {
      return;
    }
  } while( true );
}

Assistant:

void hexdump(const char *data, const char *mask, size_t len)
{
    const char *bold_gray = "\x1b[30;1m";
    const char *reset      = "\x1b[0m";
    int offset = 0;
    while(1)
    {
        //print line
        printf("#%07x: ", offset);

        int char_covered = 0;

        //print hex groups (8)
        for(int i=0; i<8; ++i) {

            //print doublet
            for(int j=0; j<2; ++j) {
                int loffset = offset + 2*i + j;
                if(loffset >= (int)len)
                    goto escape;

                //print hex
                {
                    //start highlight
                    if(mask && mask[loffset]){printf("%s", bold_gray);}

                    //print chars
                    printf("%02x", 0xff&data[loffset]);

                    //end highlight
                    if(mask && mask[loffset]){printf("%s", reset);}
                    char_covered += 2;
                }
            }
            printf(" ");
            char_covered += 1;
        }
escape:

        //print filler if needed
        for(int i=char_covered; i<41; ++i)
            printf(" ");

        //print ascii (16)
        for(int i=0; i<16; ++i) {
            if(isprint(data[offset+i]))
                printf("%c", data[offset+i]);
            else
                printf(".");
        }
        printf("\n");
        offset += 16;
        if(offset >= (int)len)
            return;
    }
}